

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool string_storeat(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  uint uVar1;
  gravity_object_t *pgVar2;
  gravity_object_t *pgVar3;
  uint32_t uVar4;
  gravity_fiber_t *pgVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  gravity_value_t value;
  char _buffer [4096];
  char local_1028 [4104];
  
  if (args[1].isa == gravity_class_int) {
    if (args[2].isa == gravity_class_string) {
      pgVar2 = (args->field_1).p;
      uVar7 = args[1].field_1.n;
      if ((int)uVar7 < 0) {
        uVar7 = (ulong)(uint)((int)uVar7 + *(int *)((long)&pgVar2->identifier + 4));
      }
      uVar6 = (uint)uVar7;
      if (((int)uVar6 < 0) || (uVar1 = *(uint *)((long)&pgVar2->identifier + 4), uVar1 <= uVar6)) {
        snprintf(local_1028,0x1000,"Out of bounds error: index %d beyond bounds 0...%d",uVar7,
                 (ulong)(*(int *)((long)&pgVar2->identifier + 4) - 1));
        pgVar5 = gravity_vm_fiber(vm);
        gravity_fiber_seterror(pgVar5,local_1028);
        goto LAB_0012a3c4;
      }
      pgVar3 = args[2].field_1.p;
      if ((*(int *)((long)&pgVar3->identifier + 4) + uVar6) - 1 < uVar1) {
        if (uVar6 < *(int *)((long)&pgVar3->identifier + 4) + uVar6) {
          lVar8 = 0;
          do {
            *(undefined1 *)((long)&pgVar2->objclass->isa + lVar8 + (uVar7 & 0xffffffff)) =
                 *(undefined1 *)((long)&pgVar3->objclass->isa + lVar8);
            lVar8 = lVar8 + 1;
          } while (uVar6 + (int)lVar8 < *(int *)((long)&pgVar3->identifier + 4) + uVar6);
        }
        uVar4 = gravity_hash_compute_buffer
                          ((char *)pgVar2->objclass,*(uint32_t *)((long)&pgVar2->identifier + 4));
        *(uint32_t *)&pgVar2->identifier = uVar4;
        return true;
      }
      memcpy(local_1028,
             "Out of bounds error: End of inserted string exceeds the length of the initial string",
             0x55);
    }
    else {
      builtin_strncpy(local_1028 + 0x20," a string index",0x10);
      builtin_strncpy(local_1028 + 0x10,"o be assigned to",0x10);
      builtin_strncpy(local_1028,"A string needs t",0x10);
    }
  }
  else {
    builtin_strncpy(local_1028,"An integer index is required to access a string item.",0x36);
  }
  pgVar5 = gravity_vm_fiber(vm);
  gravity_fiber_seterror(pgVar5,local_1028);
LAB_0012a3c4:
  value.field_1.n = 0;
  value.isa = gravity_class_null;
  gravity_vm_setslot(vm,value,rindex);
  return false;
}

Assistant:

static bool string_storeat (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs, rindex)

    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    gravity_value_t idxvalue = GET_VALUE(1);
    if (!VALUE_ISA_INT(idxvalue)) RETURN_ERROR("An integer index is required to access a string item.");
    if (!VALUE_ISA_STRING(GET_VALUE(2))) RETURN_ERROR("A string needs to be assigned to a string index");

    gravity_string_t *value = VALUE_AS_STRING(GET_VALUE(2));
    register int32_t index = (int32_t)VALUE_AS_INT(idxvalue);

    if (index < 0) index = string->len + index;
    if (index < 0 || index >= string->len) RETURN_ERROR("Out of bounds error: index %d beyond bounds 0...%d", index, string->len-1);
    if (index+value->len - 1 >= string->len) RETURN_ERROR("Out of bounds error: End of inserted string exceeds the length of the initial string");

    // this code is not UTF-8 safe
    for (int i = index; i < index+value->len; ++i) {
        string->s[i] = value->s[i-index];
    }

    // characters inside string changed so we need to re-compute hash
    string->hash = gravity_hash_compute_buffer((const char *)string->s, string->len);

    RETURN_NOVALUE();
}